

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnoui.c
# Opt level: O1

char * prev_path_ele(char *start,char *p,size_t *ele_len)

{
  char *pcVar1;
  bool bVar2;
  char *in_RAX;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  
  if (p == start) {
    return (char *)0x0;
  }
  iVar6 = 0;
  pcVar5 = (char *)0x0;
  do {
    if (p == start) {
      *ele_len = (ulong)((uint)(pcVar5 != (char *)0x0) * 2);
      bVar2 = false;
      in_RAX = pcVar5;
    }
    else {
      uVar7 = -(long)p;
      do {
        pcVar4 = p;
        p = start;
        if (pcVar4 == start) goto LAB_0020f2f1;
        uVar7 = uVar7 + 1;
        p = pcVar4 + -1;
      } while (pcVar4[-1] == '/');
      p = pcVar4;
      if (pcVar4 == start) {
LAB_0020f2f1:
        *ele_len = 0;
LAB_0020f2f8:
        bVar2 = false;
        in_RAX = p;
      }
      else {
        do {
          p = start;
          if (pcVar4 == start) break;
          pcVar1 = pcVar4 + -1;
          p = pcVar4;
          pcVar4 = pcVar4 + -1;
        } while (*pcVar1 != '/');
        sVar3 = (1 - (long)p) - uVar7;
        if (sVar3 == 2) {
LAB_0020f332:
          if ((*p != '.') || (p[1] != '.')) goto LAB_0020f349;
          iVar6 = iVar6 + 1;
          if (pcVar5 == (char *)0x0) {
            pcVar5 = p;
          }
        }
        else {
          if (sVar3 == 1) {
            bVar2 = true;
            if (*p == '.') goto LAB_0020f2fe;
            if (~(ulong)p == uVar7) goto LAB_0020f332;
          }
LAB_0020f349:
          if (iVar6 == 0) {
            *ele_len = sVar3;
            iVar6 = 0;
            goto LAB_0020f2f8;
          }
          iVar6 = iVar6 + -1;
          if (iVar6 == 0) {
            pcVar5 = (char *)0x0;
          }
        }
        bVar2 = true;
      }
    }
LAB_0020f2fe:
    if (!bVar2) {
      return in_RAX;
    }
  } while( true );
}

Assistant:

static const char *prev_path_ele(const char *start, const char *p,
                                 size_t *ele_len)
{
    int cancel = 0;
    const char *dotdot = 0;

    /* if we're at the start of the string, there are no more elements */
    if (p == start)
        return 0;

    /* keep going until we find a suitable element */
    for (;;)
    {
        const char *endp;

        /*
         *   If we've reached the start of the string, it means that we have
         *   ".."'s that canceled out every earlier element of the string.
         *   If the cancel count is non-zero, it means that we have one or
         *   more ".."'s that are significant (in that they cancel out
         *   relative elements before the start of the string).  If the
         *   cancel count is zero, it means that we've exactly canceled out
         *   all remaining elements in the string.
         */
        if (p == start)
        {
            *ele_len = (dotdot != 0 ? 2 : 0);
            return dotdot;
        }
        
        /* 
         *   back up through any adjacent path separators before the current
         *   element, so that we're pointing to the first separator after the
         *   previous element
         */
        for ( ; p != start && ispathchar(*(p-1)) ; --p) ;

        /*
         *   If we're at the start of the string, this is an absolute path.
         *   Treat it specially by returning a zero-length initial element. 
         */
        if (p == start)
        {
            *ele_len = 0;
            return p;
        }

        /* note where the current element ends */
        endp = p;

        /* now back up to the path separator before this element */
        for ( ; p != start && !ispathchar(*(p-1)) ; --p) ;

        /* 
         *   if this is ".", skip it, since this simply means that this
         *   element matches the same folder as the previous element 
         */
        if (endp - p == 1 && p[0] == '.')
            continue;

        /* 
         *   if this is "..", it cancels out the preceding non-relative
         *   element; up the cancel count and keep searching 
         */
        if (endp - p == 2 && p[0] == '.' && p[1] == '.')
        {
            /* up the cancel count */
            ++cancel;

            /* if this is the first ".." we've encountered, note it */
            if (dotdot == 0)
                dotdot = p;

            /* keep searching */
            continue;
        }

        /*
         *   This is an ordinary path element, not a relative "." or ".."
         *   link.  If we have a non-zero cancel count, we're still working
         *   on canceling out elements from ".."'s we found later in the
         *   string.
         */
        if (cancel != 0)
        {
            /* this absorbs one level of cancellation */
            --cancel;

            /* 
             *   if that's the last cancellation, we've absorbed all ".."
             *   effects, so the last ".." we found is no longer significant 
             */
            if (cancel == 0)
                dotdot = 0;

            /* keep searching */
            continue;
        }

        /* this item isn't canceled out by a "..", so it's our winner */
        *ele_len = endp - p;
        return p;
    }
}